

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int luaopen_package(lua_State *L)

{
  int iVar1;
  char *k;
  lua_State *in_RDI;
  int noenv;
  int i;
  GCfunc *fn_1;
  GCfunc *fn;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int noenv_00;
  lua_State *L_00;
  char *in_stack_ffffffffffffffc0;
  int szhint;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  lua_State *in_stack_ffffffffffffffd0;
  int idx;
  lua_State *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  int idx_00;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffec;
  int idx_01;
  code *L_01;
  
  luaL_newmetatable((lua_State *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                    in_stack_ffffffffffffffe0);
  L_01 = lj_cf_package_unloadlib;
  idx_01 = 1;
  uVar2 = 0;
  L_00 = in_RDI;
  lua_pushcclosure(in_stack_ffffffffffffffd0,
                   (lua_CFunction)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  k = (char *)(ulong)in_RDI->top[-1].u32.lo;
  k[6] = (char)idx_01;
  *(uint32_t *)(k + 0x10) = (in_RDI->glref).ptr32 + 0xec;
  lua_setfield((lua_State *)CONCAT44(idx_01,uVar2),0,(char *)in_stack_ffffffffffffffd8);
  luaL_register((lua_State *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                (luaL_Reg *)0x11c3e8);
  lua_pushvalue(L_00,in_stack_ffffffffffffffb4);
  lua_replace(L_00,in_stack_ffffffffffffffb4);
  lua_createtable(in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                  (int)in_stack_ffffffffffffffd0);
  for (noenv_00 = 0; package_loaders[noenv_00] != (lua_CFunction)0x0; noenv_00 = noenv_00 + 1) {
    in_stack_ffffffffffffffd0 = (lua_State *)package_loaders[noenv_00];
    in_stack_ffffffffffffffcc = 1;
    in_stack_ffffffffffffffc8 = 0;
    in_stack_ffffffffffffffd8 = L_00;
    lua_pushcclosure(in_stack_ffffffffffffffd0,(lua_CFunction)&DAT_100000000,
                     (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    in_stack_ffffffffffffffc0 = (char *)(ulong)in_stack_ffffffffffffffd8->top[-1].u32.lo;
    in_stack_ffffffffffffffc0[6] = (char)in_stack_ffffffffffffffcc;
    *(uint32_t *)(in_stack_ffffffffffffffc0 + 0x10) =
         (in_stack_ffffffffffffffd8->glref).ptr32 + 0xec;
    lua_rawseti(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  }
  lua_setfield((lua_State *)CONCAT44(idx_01,uVar2),(int)((ulong)k >> 0x20),
               (char *)in_stack_ffffffffffffffd8);
  lua_getfield((lua_State *)L_01,idx_01,k);
  idx_00 = (int)((ulong)k >> 0x20);
  iVar1 = lua_toboolean((lua_State *)CONCAT44(noenv_00,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac);
  lua_settop((lua_State *)CONCAT44(noenv_00,iVar1),in_stack_ffffffffffffffac);
  setpath(in_stack_ffffffffffffffd0,
          (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          in_stack_ffffffffffffffc0,(char *)L_00,noenv_00);
  setpath(in_stack_ffffffffffffffd0,
          (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          in_stack_ffffffffffffffc0,(char *)L_00,noenv_00);
  idx = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  lua_pushlstring((lua_State *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                  in_stack_ffffffffffffffc0,(size_t)L_00);
  szhint = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  lua_setfield((lua_State *)CONCAT44(idx_01,uVar2),idx_00,(char *)in_stack_ffffffffffffffd8);
  luaL_findtable(in_stack_ffffffffffffffd8,idx,
                 (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),szhint);
  lua_setfield((lua_State *)CONCAT44(idx_01,uVar2),idx_00,(char *)in_stack_ffffffffffffffd8);
  luaL_findtable(in_stack_ffffffffffffffd8,idx,
                 (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),szhint);
  lua_setfield((lua_State *)CONCAT44(idx_01,uVar2),idx_00,(char *)in_stack_ffffffffffffffd8);
  lua_pushvalue(L_00,noenv_00);
  luaL_register((lua_State *)CONCAT44(noenv_00,iVar1),
                (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                (luaL_Reg *)0x11c61d);
  lua_settop((lua_State *)CONCAT44(noenv_00,iVar1),in_stack_ffffffffffffffac);
  return 1;
}

Assistant:

LUALIB_API int luaopen_package(lua_State *L)
{
  int i;
  int noenv;
  luaL_newmetatable(L, "_LOADLIB");
  lj_lib_pushcf(L, lj_cf_package_unloadlib, 1);
  lua_setfield(L, -2, "__gc");
  luaL_register(L, LUA_LOADLIBNAME, package_lib);
  lua_pushvalue(L, -1);
  lua_replace(L, LUA_ENVIRONINDEX);
  lua_createtable(L, sizeof(package_loaders)/sizeof(package_loaders[0])-1, 0);
  for (i = 0; package_loaders[i] != NULL; i++) {
    lj_lib_pushcf(L, package_loaders[i], 1);
    lua_rawseti(L, -2, i+1);
  }
  lua_setfield(L, -2, "loaders");
  lua_getfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  noenv = lua_toboolean(L, -1);
  lua_pop(L, 1);
  setpath(L, "path", LUA_PATH, LUA_PATH_DEFAULT, noenv);
  setpath(L, "cpath", LUA_CPATH, LUA_CPATH_DEFAULT, noenv);
  lua_pushliteral(L, LUA_PATH_CONFIG);
  lua_setfield(L, -2, "config");
  luaL_findtable(L, LUA_REGISTRYINDEX, "_LOADED", 16);
  lua_setfield(L, -2, "loaded");
  luaL_findtable(L, LUA_REGISTRYINDEX, "_PRELOAD", 4);
  lua_setfield(L, -2, "preload");
  lua_pushvalue(L, LUA_GLOBALSINDEX);
  luaL_register(L, NULL, package_global);
  lua_pop(L, 1);
  return 1;
}